

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O2

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::X<double>
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,TPZFMatrix<double> *coord,
          TPZVec<double> *loc,TPZVec<double> *result)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double local_a0;
  TPZManVector<double,_3> xqsiLxc;
  TPZManVector<double,_3> xqsi;
  
  xqsiLxc.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&xqsi,3,(double *)&xqsiLxc);
  local_a0 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&xqsiLxc,3,&local_a0);
  TPZGeoBlend<pzgeom::TPZGeoQuad>::X<double>
            (&this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>,coord,loc,&xqsi.super_TPZVec<double>);
  pdVar1 = (this->fxc).fStore;
  dVar4 = 0.0;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    dVar5 = xqsi.super_TPZVec<double>.fStore[lVar3] - pdVar1[lVar3];
    xqsiLxc.super_TPZVec<double>.fStore[lVar3] = dVar5;
    dVar4 = dVar4 + dVar5 * dVar5;
  }
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  pdVar1 = (this->fxc).fStore;
  pdVar2 = result->fStore;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    pdVar2[lVar3] = (xqsiLxc.super_TPZVec<double>.fStore[lVar3] * this->fR) / dVar4 + pdVar1[lVar3];
  }
  TPZManVector<double,_3>::~TPZManVector(&xqsiLxc);
  TPZManVector<double,_3>::~TPZManVector(&xqsi);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
		{
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> xqsiLxc(3,0.); // will store (x,y,z)-xc
            GeomQuad::X(coord,loc,xqsi); // gives the map (qsi,eta) to (x,y,z)
            
            T norm = 0.;
            for (int i = 0; i < 3; i++) { // Does xqsi-xc and calculates its norm
                xqsiLxc[i] = xqsi[i] - fxc[i];
                norm += xqsiLxc[i] * xqsiLxc[i];
            }
            norm = sqrt(norm);
            
            for (int i = 0; i < 3; i++) {
                result[i] = fxc[i] + xqsiLxc[i] * fR / norm;
            }
                
            
		}